

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O3

int ffs2c_nopad(char *instr,char *outstr,int *status)

{
  char cVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  char *pcVar7;
  
  if (0 < *status) {
    return *status;
  }
  if (instr == (char *)0x0) {
    outstr[2] = '\0';
    outstr[0] = '\'';
    outstr[1] = '\'';
    goto LAB_001bd846;
  }
  *outstr = '\'';
  sVar2 = strlen(instr);
  uVar5 = 0x44;
  if (sVar2 < 0x44) {
    uVar5 = sVar2;
  }
  if (sVar2 == 0) {
    uVar3 = 1;
LAB_001bd837:
    pcVar7 = outstr + uVar3 + 1;
    outstr[uVar3] = '\'';
  }
  else {
    uVar6 = 1;
    uVar3 = 1;
    do {
      cVar1 = instr[uVar6 - 1];
      outstr[uVar3] = cVar1;
      uVar4 = uVar3;
      if (cVar1 == '\'') {
        outstr[uVar3 + 1] = '\'';
        uVar4 = uVar3 + 1;
      }
      uVar3 = uVar4 + 1;
    } while ((uVar6 < uVar5) && (uVar6 = uVar6 + 1, uVar4 < 0x44));
    if (uVar3 != 0x46) goto LAB_001bd837;
    pcVar7 = outstr + 0x45;
  }
  *pcVar7 = '\0';
LAB_001bd846:
  return *status;
}

Assistant:

int ffs2c_nopad(const char *instr, /* I - null terminated input string  */
          char *outstr,      /* O - null terminated quoted output string */
          int *status)       /* IO - error status */
/*
   This performs identically to ffs2c except that it won't pad output
   strings to make them a minimum of 8 chars long.  The requirement
   that FITS keyword string values be 8 characters is now obsolete
   (except for "XTENSION" keyword), but for backwards compatibility we'll
   keep ffs2c the way it is.  A better solution would be to add another
   argument to ffs2c for 'pad' or 'nopad', but it is called from many other
   places in Heasoft outside of CFITSIO.  
*/
{
    size_t len, ii, jj;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (!instr)            /* a null input pointer?? */
    {
       strcpy(outstr, "''");   /* a null FITS string */
       return(*status);
    }

    outstr[0] = '\'';      /* start output string with a quote */

    len = strlen(instr);
    if (len > 68)
        len = 68;    /* limit input string to 68 chars */

    for (ii=0, jj=1; ii < len && jj < 69; ii++, jj++)
    {
        outstr[jj] = instr[ii];  /* copy each char from input to output */
        if (instr[ii] == '\'')
        {
            jj++;
            outstr[jj]='\'';   /* duplicate any apostrophies in the input */
        }
    }

    if (jj == 70)   /* only occurs if the last char of string was a quote */
        outstr[69] = '\0';
    else
    {
        outstr[jj] = '\'';         /* append closing quote character */
        outstr[jj+1] = '\0';          /* terminate the string */
    }

    return(*status);
}